

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O0

void __thiscall index_tree::find(index_tree *this,wstring *content,size_t cursor,int *count)

{
  index_tree *in_RDI;
  size_t begin_cursor;
  wstring *in_stack_00000038;
  index *in_stack_00000040;
  int in_stack_ffffffffffffffcc;
  
  set_current_index(in_RDI,in_stack_ffffffffffffffcc);
  set_active(in_RDI,true);
  while ((in_RDI->active_ & 1U) != 0) {
    std::__shared_ptr_access<index,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<index,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11970e);
    index::find(in_stack_00000040,in_stack_00000038,(size_t)this,(size_t *)content,(int *)cursor);
  }
  return;
}

Assistant:

void index_tree::find(const std::wstring& content, std::size_t cursor, int& count)
{
    std::size_t begin_cursor = cursor;
    // 将当前索引设置为一级索引
    set_current_index(1);

    set_active(true);
    while (active_)
    {
        current_index_->find(content, begin_cursor, cursor, count);
    }
}